

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_between_expression.cpp
# Opt level: O1

bool __thiscall
duckdb::BoundBetweenExpression::Equals(BoundBetweenExpression *this,BaseExpression *other_p)

{
  undefined1 uVar1;
  undefined1 uVar3;
  ulong uVar2;
  undefined6 uVar4;
  bool bVar5;
  int iVar6;
  BoundBetweenExpression *pBVar7;
  type pEVar8;
  type pEVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [11];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar13 [12];
  undefined1 auVar18 [16];
  undefined1 auVar14 [13];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar20 [16];
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  
  bVar5 = BaseExpression::Equals((BaseExpression *)this,other_p);
  if ((bVar5) &&
     (bVar5 = LogicalType::operator==
                        (&(this->super_Expression).return_type,(LogicalType *)(other_p + 1)), bVar5)
     ) {
    pBVar7 = BaseExpression::Cast<duckdb::BoundBetweenExpression>(other_p);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&this->input);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pBVar7->input);
    iVar6 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[10])(pEVar8,pEVar9);
    if ((char)iVar6 != '\0') {
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this->lower);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pBVar7->lower);
      iVar6 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[10])(pEVar8,pEVar9);
      if ((char)iVar6 != '\0') {
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&this->upper);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&pBVar7->upper);
        iVar6 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[10])(pEVar8,pEVar9);
        if ((char)iVar6 != '\0') {
          uVar2._0_1_ = this->lower_inclusive;
          uVar2._1_1_ = this->upper_inclusive;
          uVar2._2_6_ = *(undefined6 *)&this->field_0x72;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar2;
          uVar1 = pBVar7->lower_inclusive;
          uVar3 = pBVar7->upper_inclusive;
          uVar4 = *(undefined6 *)&pBVar7->field_0x72;
          auVar15[0] = -(uVar1 == (undefined1)uVar2);
          cVar22 = -((char)uVar4 == (char)uVar2._2_6_);
          cVar23 = -((char)((uint6)uVar4 >> 8) == (char)((uint6)uVar2._2_6_ >> 8));
          cVar24 = -((char)((uint6)uVar4 >> 0x10) == (char)((uint6)uVar2._2_6_ >> 0x10));
          cVar25 = -((char)((uint6)uVar4 >> 0x18) == (char)((uint6)uVar2._2_6_ >> 0x18));
          cVar26 = -((char)((uint6)uVar4 >> 0x20) == (char)((uint6)uVar2._2_6_ >> 0x20));
          bVar27 = -((char)((uint6)uVar4 >> 0x28) == (char)((uint6)uVar2._2_6_ >> 0x28));
          auVar16._0_9_ = CONCAT18(0xff,(ulong)bVar27 << 0x38);
          auVar12._0_10_ = CONCAT19(0xff,auVar16._0_9_);
          auVar12[10] = 0xff;
          auVar13[0xb] = 0xff;
          auVar13._0_11_ = auVar12;
          auVar14[0xc] = 0xff;
          auVar14._0_12_ = auVar13;
          auVar21[0xd] = 0xff;
          auVar21._0_13_ = auVar14;
          auVar21[0xe] = bVar27;
          auVar21[0xf] = bVar27;
          auVar20._14_2_ = auVar21._14_2_;
          auVar20[0xd] = cVar26;
          auVar20._0_13_ = auVar14;
          auVar19._13_3_ = auVar20._13_3_;
          auVar19[0xc] = cVar26;
          auVar19._0_12_ = auVar13;
          auVar18._12_4_ = auVar19._12_4_;
          auVar18[0xb] = cVar25;
          auVar18._0_11_ = auVar12;
          auVar17._11_5_ = auVar18._11_5_;
          auVar17[10] = cVar25;
          auVar17._0_10_ = auVar12._0_10_;
          auVar16._10_6_ = auVar17._10_6_;
          auVar16[9] = cVar24;
          auVar15._8_8_ = (undefined8)(CONCAT72(auVar16._9_7_,CONCAT11(cVar24,bVar27)) >> 8);
          auVar15[7] = cVar23;
          auVar15[6] = cVar23;
          auVar15[5] = cVar22;
          auVar15[4] = cVar22;
          auVar15[3] = -(uVar3 == uVar2._1_1_);
          auVar15[2] = -(uVar3 == uVar2._1_1_);
          auVar15[1] = auVar15[0];
          auVar10 = pshuflw(auVar10,auVar15,0x50);
          auVar11._0_4_ = auVar10._0_4_;
          auVar11._4_4_ = auVar11._0_4_;
          auVar11._8_4_ = auVar10._4_4_;
          auVar11._12_4_ = auVar10._4_4_;
          iVar6 = movmskpd(iVar6,auVar11);
          return iVar6 == 3;
        }
      }
    }
  }
  return false;
}

Assistant:

bool BoundBetweenExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundBetweenExpression>();
	if (!Expression::Equals(*input, *other.input)) {
		return false;
	}
	if (!Expression::Equals(*lower, *other.lower)) {
		return false;
	}
	if (!Expression::Equals(*upper, *other.upper)) {
		return false;
	}
	return lower_inclusive == other.lower_inclusive && upper_inclusive == other.upper_inclusive;
}